

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDfs.c
# Opt level: O0

void Aig_SupportNodes(Aig_Man_t *p,Aig_Obj_t **ppObjs,int nObjs,Vec_Ptr_t *vSupp)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  int local_2c;
  int i;
  Vec_Ptr_t *vSupp_local;
  int nObjs_local;
  Aig_Obj_t **ppObjs_local;
  Aig_Man_t *p_local;
  
  Vec_PtrClear(vSupp);
  Aig_ManIncrementTravId(p);
  pAVar2 = Aig_ManConst1(p);
  Aig_ObjSetTravIdCurrent(p,pAVar2);
  local_2c = 0;
  while( true ) {
    if (nObjs <= local_2c) {
      return;
    }
    iVar1 = Aig_IsComplement(ppObjs[local_2c]);
    if (iVar1 != 0) break;
    iVar1 = Aig_ObjIsCo(ppObjs[local_2c]);
    if (iVar1 == 0) {
      Aig_Support_rec(p,ppObjs[local_2c],vSupp);
    }
    else {
      pAVar2 = Aig_ObjFanin0(ppObjs[local_2c]);
      Aig_Support_rec(p,pAVar2,vSupp);
    }
    local_2c = local_2c + 1;
  }
  __assert_fail("!Aig_IsComplement(ppObjs[i])",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigDfs.c"
                ,0x35e,"void Aig_SupportNodes(Aig_Man_t *, Aig_Obj_t **, int, Vec_Ptr_t *)");
}

Assistant:

void Aig_SupportNodes( Aig_Man_t * p, Aig_Obj_t ** ppObjs, int nObjs, Vec_Ptr_t * vSupp )
{
    int i;
    Vec_PtrClear( vSupp );
    Aig_ManIncrementTravId( p );
    Aig_ObjSetTravIdCurrent( p, Aig_ManConst1(p) );
    for ( i = 0; i < nObjs; i++ )
    {
        assert( !Aig_IsComplement(ppObjs[i]) );
        if ( Aig_ObjIsCo(ppObjs[i]) )
            Aig_Support_rec( p, Aig_ObjFanin0(ppObjs[i]), vSupp );
        else
            Aig_Support_rec( p, ppObjs[i], vSupp );
    }
}